

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_is_connected(Curl_easy *data,connectdata *conn,int sockindex,_Bool *connected)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  _Bool _Var10;
  uint uVar11;
  uint uVar12;
  CURLcode CVar13;
  timediff_t tVar14;
  int *piVar15;
  char *pcVar16;
  curltime cVar17;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  timediff_t local_1d8;
  char *pcStack_1b0;
  CURLcode failreason;
  char *hostname;
  char buffer [256];
  char ipaddress [46];
  CURLcode status;
  int other;
  uint local_60;
  uint i;
  int rc;
  curltime now;
  int error;
  timediff_t allow;
  CURLcode result;
  _Bool *connected_local;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  allow._4_4_ = CURLE_OK;
  now._12_4_ = 0;
  *connected = false;
  if (((conn->bits).tcpconnect[sockindex] & 1U) == 0) {
    cVar17 = Curl_now();
    _i = cVar17.tv_sec;
    now.tv_sec._0_4_ = cVar17.tv_usec;
    if (((conn->cnnct).state == CONNECT_INIT) || (CONNECT_REQ_READ_MORE < (conn->cnnct).state)) {
      for (local_60 = 0; local_60 < 2; local_60 = local_60 + 1) {
        uVar11 = local_60 ^ 1;
        if (conn->tempsock[local_60] != -1) {
          now._12_4_ = 0;
          uVar12 = Curl_socket_check(-1,-1,conn->tempsock[local_60],0);
          if (uVar12 == 0) {
            cVar17.tv_usec = (int)now.tv_sec;
            cVar17.tv_sec = _i;
            uVar1 = (conn->connecttime).tv_sec;
            uVar2 = (conn->connecttime).tv_usec;
            older.tv_usec = uVar2;
            older.tv_sec = uVar1;
            cVar17._12_4_ = 0;
            older._12_4_ = 0;
            tVar14 = Curl_timediff(cVar17,older);
            if (conn->timeoutms_per_addr[local_60] <= tVar14) {
              Curl_infof(data,"After %ldms connect time, move on!",
                         conn->timeoutms_per_addr[local_60]);
              now._12_4_ = 0x6e;
            }
            if (((local_60 == 0) && ((*(uint *)&(conn->bits).field_0x4 >> 0x1e & 1) == 0)) &&
               (newer.tv_usec = (int)now.tv_sec, newer.tv_sec = _i,
               uVar3 = (conn->connecttime).tv_sec, uVar4 = (conn->connecttime).tv_usec,
               older_00.tv_usec = uVar4, older_00.tv_sec = uVar3, newer._12_4_ = 0,
               older_00._12_4_ = 0, tVar14 = Curl_timediff(newer,older_00),
               (long)(ulong)(data->set).happy_eyeballs_timeout <= tVar14)) {
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xbfffffff | 0x40000000;
              trynextip(data,conn,sockindex,1);
            }
          }
          else if ((uVar12 == 2) || ((*(uint *)&(conn->bits).field_0x4 >> 0x19 & 1) != 0)) {
            _Var10 = verifyconnect(conn->tempsock[local_60],(int *)&now.field_0xc);
            if (_Var10) {
              conn->sock[sockindex] = conn->tempsock[local_60];
              conn->ip_addr = conn->tempaddr[local_60];
              conn->tempsock[local_60] = -1;
              *(uint *)&(conn->bits).field_0x4 =
                   *(uint *)&(conn->bits).field_0x4 & 0xffffefff |
                   (uint)(conn->ip_addr->ai_family == 10) << 0xc;
              if (conn->tempsock[(int)uVar11] != -1) {
                Curl_closesocket(data,conn,conn->tempsock[(int)uVar11]);
                conn->tempsock[(int)uVar11] = -1;
              }
              CVar13 = connect_SOCKS(data,sockindex,connected);
              if (CVar13 != CURLE_OK) {
                return CVar13;
              }
              if ((*connected & 1U) == 0) {
                return CURLE_OK;
              }
              post_SOCKS(data,conn,sockindex,connected);
              return CURLE_OK;
            }
          }
          else if ((uVar12 & 4) != 0) {
            verifyconnect(conn->tempsock[local_60],(int *)&now.field_0xc);
          }
          uVar9 = now._12_4_;
          if (now._12_4_ != 0) {
            (data->state).os_errno = now._12_4_;
            piVar15 = __errno_location();
            *piVar15 = uVar9;
            if (conn->tempaddr[local_60] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[local_60],buffer + 0xf8,0x2e);
              uVar12 = conn->port;
              pcVar16 = Curl_strerror(now._12_4_,(char *)&hostname,0x100);
              Curl_infof(data,"connect to %s port %u failed: %s",buffer + 0xf8,(ulong)uVar12,pcVar16
                        );
              local_1d8 = Curl_timeleft(data,(curltime *)&i,true);
              if (conn->tempaddr[local_60]->ai_next != (Curl_addrinfo *)0x0) {
                local_1d8 = local_1d8 / 2;
              }
              conn->timeoutms_per_addr[local_60] = local_1d8;
              ainext(conn,local_60,true);
              CVar13 = trynextip(data,conn,sockindex,local_60);
              if (((CVar13 != CURLE_COULDNT_CONNECT) || (conn->tempsock[(int)uVar11] == -1)) &&
                 (allow._4_4_ == CURLE_OK)) {
                allow._4_4_ = CVar13;
              }
            }
          }
        }
      }
      tVar14 = Curl_timeleft(data,(curltime *)&i,true);
      if (tVar14 < 0) {
        newer_00.tv_usec = (int)now.tv_sec;
        newer_00.tv_sec = _i;
        uVar5 = (data->progress).t_startsingle.tv_sec;
        uVar6 = (data->progress).t_startsingle.tv_usec;
        older_01.tv_usec = uVar6;
        older_01.tv_sec = uVar5;
        newer_00._12_4_ = 0;
        older_01._12_4_ = 0;
        tVar14 = Curl_timediff(newer_00,older_01);
        Curl_failf(data,"Connection timeout after %ld ms",tVar14);
        data_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
      }
      else {
        if (((allow._4_4_ == CURLE_OK) || (conn->tempsock[0] != -1)) || (conn->tempsock[1] != -1)) {
          allow._4_4_ = CURLE_OK;
        }
        else {
          CVar13 = trynextip(data,conn,sockindex,1);
          if (CVar13 == CURLE_OK) {
            return CURLE_OK;
          }
          if ((*(uint *)&(conn->bits).field_0x4 >> 1 & 1) == 0) {
            if ((*(uint *)&(conn->bits).field_0x4 & 1) == 0) {
              if ((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0) {
                pcStack_1b0 = (conn->host).name;
              }
              else {
                pcStack_1b0 = (conn->conn_to_host).name;
              }
            }
            else {
              pcStack_1b0 = (conn->http_proxy).host.name;
            }
          }
          else {
            pcStack_1b0 = (conn->socks_proxy).host.name;
          }
          uVar11 = conn->port;
          newer_01.tv_usec = (int)now.tv_sec;
          newer_01.tv_sec = _i;
          uVar7 = (data->progress).t_startsingle.tv_sec;
          uVar8 = (data->progress).t_startsingle.tv_usec;
          older_02.tv_usec = uVar8;
          older_02.tv_sec = uVar7;
          newer_01._12_4_ = 0;
          older_02._12_4_ = 0;
          tVar14 = Curl_timediff(newer_01,older_02);
          pcVar16 = curl_easy_strerror(allow._4_4_);
          Curl_failf(data,"Failed to connect to %s port %u after %ld ms: %s",pcStack_1b0,
                     (ulong)uVar11,tVar14,pcVar16);
          if ((data->state).os_errno == 0x6e) {
            allow._4_4_ = CURLE_OPERATION_TIMEDOUT;
          }
        }
        data_local._4_4_ = allow._4_4_;
      }
    }
    else {
      data_local._4_4_ = connect_SOCKS(data,sockindex,connected);
      if ((data_local._4_4_ == CURLE_OK) && ((*connected & 1U) != 0)) {
        post_SOCKS(data,conn,sockindex,connected);
      }
    }
  }
  else {
    *connected = true;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_is_connected(struct Curl_easy *data,
                           struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc = 0;
  unsigned int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(data, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(data, conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;
    error = 0;
#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(data, conn, i, connected);
      if(!result && *connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        post_SOCKS(data, conn, sockindex, connected);
        connkeep(conn, "HTTP/3 default");
        if(conn->tempsock[other] != CURL_SOCKET_BAD)
          Curl_quic_disconnect(data, conn, other);
        return CURLE_OK;
      }
      /* When a QUIC connect attempt fails, the better error explanation is in
         'result' and not in errno */
      if(result) {
        conn->tempsock[i] = CURL_SOCKET_BAD;
        error = SOCKERRNO;
      }
    }
    else
#endif
    {
#ifdef mpeix
      /* Call this function once now, and ignore the results. We do this to
         "clear" the error state on the socket so that we can later read it
         reliably. This is reported necessary on the MPE/iX operating
         system. */
      (void)verifyconnect(conn->tempsock[i], NULL);
#endif

      /* check socket for connect */
      rc = SOCKET_WRITABLE(conn->tempsock[i], 0);
    }

    if(rc == 0) { /* no connection yet */
      if(Curl_timediff(now, conn->connecttime) >=
         conn->timeoutms_per_addr[i]) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!", conn->timeoutms_per_addr[i]);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && !conn->bits.parallel_connect &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        conn->bits.parallel_connect = TRUE; /* starting now */
        trynextip(data, conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(data, conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(data, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(data, conn, sockindex, connected);

        return CURLE_OK;
      }
    }
    else if(rc & CURL_CSELECT_ERR) {
      (void)verifyconnect(conn->tempsock[i], &error);
    }

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress,
                               sizeof(ipaddress));
#ifdef ENABLE_QUIC
        if(conn->transport == TRNSPRT_QUIC) {
          infof(data, "connect to %s port %u failed: %s",
                ipaddress, conn->port, curl_easy_strerror(result));
        }
        else
#endif
        infof(data, "connect to %s port %u failed: %s",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));
#endif

        allow = Curl_timeleft(data, &now, TRUE);
        conn->timeoutms_per_addr[i] = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;
        ainext(conn, i, TRUE);
        status = trynextip(data, conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD) {
          /* the last attempt failed and no other sockets remain open */
          if(!result)
            result = status;
        }
      }
    }
  }

  /*
   * Now that we've checked whether we are connected, check whether we've
   * already timed out.
   *
   * First figure out how long time we have left to connect */

  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection timeout after %ld ms",
          Curl_timediff(now, data->progress.t_startsingle));
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(result &&
     (conn->tempsock[0] == CURL_SOCKET_BAD) &&
     (conn->tempsock[1] == CURL_SOCKET_BAD)) {
    /* no more addresses to try */
    const char *hostname;
    CURLcode failreason = result;

    /* if the first address family runs out of addresses to try before the
       happy eyeball timeout, go ahead and try the next family now */
    result = trynextip(data, conn, sockindex, 1);
    if(!result)
      return result;

    result = failreason;

#ifndef CURL_DISABLE_PROXY
    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else
#endif
      if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %u after "
          "%" CURL_FORMAT_TIMEDIFF_T " ms: %s",
          hostname, conn->port,
          Curl_timediff(now, data->progress.t_startsingle),
          curl_easy_strerror(result));

    Curl_quic_disconnect(data, conn, 0);
    Curl_quic_disconnect(data, conn, 1);

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }
  else
    result = CURLE_OK; /* still trying */

  return result;
}